

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf.cxx
# Opt level: O0

void __thiscall xray_re::xr_ogf::check_unhandled_chunks(xr_ogf *this,xr_reader *r)

{
  bool bVar1;
  xr_reader *local_28;
  xr_reader *s;
  xr_reader *pxStack_18;
  uint32_t id;
  xr_reader *r_local;
  xr_ogf *this_local;
  
  local_28 = (xr_reader *)0x0;
  pxStack_18 = r;
  r_local = (xr_reader *)this;
  while (local_28 = xr_reader::open_chunk_next(pxStack_18,(uint32_t *)((long)&s + 4),local_28),
        local_28 != (xr_reader *)0x0) {
    bVar1 = is_chunk_loaded(this,s._4_4_);
    if (!bVar1) {
      msg("unhandled chunk %u",(ulong)s._4_4_);
    }
  }
  return;
}

Assistant:

void xr_ogf::check_unhandled_chunks(xr_reader& r) const
{
	// FIXME: there is no need to "open" chunks
	uint32_t id;
	for (xr_reader* s = 0; (s = r.open_chunk_next(id, s)) != 0;) {
		if (!is_chunk_loaded(id))
			msg("unhandled chunk %u", id);
	}
}